

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int disposition_get_settled(DISPOSITION_HANDLE disposition,_Bool *settled_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  DISPOSITION_INSTANCE *disposition_instance;
  uint32_t item_count;
  int result;
  _Bool *settled_value_local;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._4_4_ = 0x2274;
  }
  else {
    _item_count = settled_value;
    settled_value_local = (_Bool *)disposition;
    iVar1 = amqpvalue_get_composite_item_count
                      (disposition->composite_value,(uint32_t *)&disposition_instance);
    if (iVar1 == 0) {
      if ((uint)disposition_instance < 4) {
        *_item_count = false;
        disposition_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(disposition->composite_value,3);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = false;
          disposition_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            disposition_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = false;
              disposition_instance._4_4_ = 0;
            }
            else {
              disposition_instance._4_4_ = 0x2295;
            }
          }
        }
      }
    }
    else {
      disposition_instance._4_4_ = 0x227c;
    }
  }
  return disposition_instance._4_4_;
}

Assistant:

int disposition_get_settled(DISPOSITION_HANDLE disposition, bool* settled_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        if (amqpvalue_get_composite_item_count(disposition_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                *settled_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(disposition_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *settled_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, settled_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *settled_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}